

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_p.h
# Opt level: O0

void __thiscall
QSystemSemaphorePrivate::QSystemSemaphorePrivate(QSystemSemaphorePrivate *this,Type type)

{
  QNativeIpcKey *in_RDI;
  Type in_stack_ffffffffffffffbe;
  
  QNativeIpcKey::QNativeIpcKey(in_RDI,in_stack_ffffffffffffffbe);
  QString::QString((QString *)0x265b94);
  *(undefined4 *)((long)&in_RDI[1].key.d.size + 4) = 0;
  QtIpcCommon::
  IpcStorageVariant<&QSystemSemaphorePrivate::Backend::posix,_&QSystemSemaphorePrivate::Backend::sysv,_&QSystemSemaphorePrivate::Backend::win32>
  ::IpcStorageVariant((IpcStorageVariant<&QSystemSemaphorePrivate::Backend::posix,_&QSystemSemaphorePrivate::Backend::sysv,_&QSystemSemaphorePrivate::Backend::win32>
                       *)0x265bae);
  constructBackend((QSystemSemaphorePrivate *)0x265bba);
  return;
}

Assistant:

QSystemSemaphorePrivate(QNativeIpcKey::Type type) : nativeKey(type)
    { constructBackend(); }